

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmCachePolicyCommon.cpp
# Opt level: O3

MEMORY_OBJECT_CONTROL_STATE __thiscall
GmmLib::GmmCachePolicyCommon::CachePolicyGetMemoryObject
          (GmmCachePolicyCommon *this,GMM_RESOURCE_INFO *pResInfo,GMM_RESOURCE_USAGE_TYPE Usage)

{
  uint uVar1;
  Context *pCVar2;
  uint uVar3;
  MEMORY_OBJECT_CONTROL_STATE *pMVar4;
  
  pCVar2 = this->pGmmLibContext;
  if (pResInfo != (GMM_RESOURCE_INFO *)0x0) {
    (*(pResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x23])(pResInfo);
    uVar1 = pCVar2->CachePolicy[Usage].Override;
    uVar3 = (*(pResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x5e])(pResInfo);
    if (((pCVar2->CachePolicy[uVar3].IDCode & uVar1) == 0) &&
       (pCVar2->CachePolicy[Usage].Override != 0xffffffff)) {
      pMVar4 = (MEMORY_OBJECT_CONTROL_STATE *)&pCVar2->CachePolicy[Usage].field_3;
      goto LAB_00108515;
    }
  }
  pMVar4 = &pCVar2->CachePolicy[Usage].MemoryObjectOverride;
LAB_00108515:
  return (MEMORY_OBJECT_CONTROL_STATE)(*pMVar4).DwordValue;
}

Assistant:

MEMORY_OBJECT_CONTROL_STATE GMM_STDCALL GmmLib::GmmCachePolicyCommon::CachePolicyGetMemoryObject(GMM_RESOURCE_INFO *pResInfo, GMM_RESOURCE_USAGE_TYPE Usage)
{
    const GMM_CACHE_POLICY_ELEMENT *CachePolicy = NULL;
    __GMM_ASSERT(pGmmLibContext->GetCachePolicyElement(Usage).Initialized);
    CachePolicy = pGmmLibContext->GetCachePolicyUsage();
    // Prevent wrong Usage for XAdapter resources. UMD does not call GetMemoryObject on shader resources but,
    // when they add it someone could call it without knowing the restriction.
    if(pResInfo &&
       pResInfo->GetResFlags().Info.XAdapter &&
       (Usage != GMM_RESOURCE_USAGE_XADAPTER_SHARED_RESOURCE))
    {
        __GMM_ASSERT(false);
    }

    if(!pResInfo ||
       (CachePolicy[Usage].Override & CachePolicy[pResInfo->GetCachePolicyUsage()].IDCode) ||
       (CachePolicy[Usage].Override == ALWAYS_OVERRIDE))
    {
        return CachePolicy[Usage].MemoryObjectOverride;
    }
    else
    {
        return CachePolicy[Usage].MemoryObjectNoOverride;
    }
}